

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O3

wchar_t curses_getpos(wchar_t *x,wchar_t *y,nh_bool force,char *goal)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  uint uVar5;
  bool bVar6;
  nh_dbuf_entry (*panVar7) [80];
  curses_drawing_info *pcVar8;
  int iVar9;
  wchar_t wVar10;
  nh_direction nVar11;
  uint uVar12;
  void *pvVar13;
  __int32_t **pp_Var14;
  void *__ptr;
  wchar_t wVar15;
  nh_dbuf_entry (*panVar16) [80];
  long lVar17;
  short *psVar18;
  short *psVar19;
  bool bVar20;
  char *pcVar21;
  short *psVar22;
  wchar_t wVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  wchar_t wVar27;
  ulong uVar28;
  wchar_t wVar29;
  wchar_t wVar30;
  bool bVar31;
  byte bVar32;
  int iVar33;
  int iVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  long lVar40;
  undefined1 auVar39 [16];
  long lVar41;
  wchar_t my;
  wchar_t mx;
  char printbuf [256];
  nh_desc_buf descbuf;
  uint local_77c;
  char *local_778;
  void *local_770;
  wchar_t local_768;
  undefined1 local_764 [12];
  short *local_758;
  wchar_t *local_750;
  wchar_t *local_748;
  ulong local_740;
  char local_738 [260];
  wchar_t local_634 [64];
  wchar_t local_534 [64];
  wchar_t local_434 [64];
  wchar_t local_334 [64];
  wchar_t local_234 [64];
  wchar_t local_134 [65];
  
  werase(statuswin);
  iVar9 = wmove(statuswin,0,0);
  if (iVar9 != -1) {
    waddnstr(statuswin,"Select a target location with the cursor: \'.\' to confirm",0xffffffff);
  }
  pcVar21 = ".";
  if (force == '\0') {
    pcVar21 = ", ESC to cancel.";
  }
  waddnstr(statuswin,pcVar21,0xffffffff);
  iVar9 = wmove(statuswin,1,0);
  if (iVar9 != -1) {
    waddnstr(statuswin,"Press \'?\' for help and tips.",0xffffffff);
  }
  wrefresh(statuswin);
  wVar30 = *x;
  if (*x < L'\x01') {
    wVar30 = player.x;
  }
  wVar10 = *y;
  if (*y < L'\0') {
    wVar10 = player.y;
  }
  psVar18 = (short *)(ulong)(uint)wVar10;
  local_750 = x;
  local_748 = y;
  wmove(mapwin,psVar18,wVar30 + L'\xffffffff');
  pcVar21 = "(\'?\' for help)";
  if (force == '\0') {
    pcVar21 = "(ESC to abort, \'?\' for help)";
  }
  local_770 = (void *)0x0;
  __ptr = (void *)0x0;
  local_778 = "(ESC to abort, \'?\' for help)";
  bVar31 = false;
  local_758 = (short *)pcVar21;
  while( true ) {
    if (bVar31) {
      local_764._0_2_ = 0;
      local_764._2_2_ = 0;
      local_768 = L'\0';
      nh_describe_pos(wVar30,psVar18,local_634);
      werase(statuswin);
      place_desc_message((WINDOW *)local_764,&local_768,local_134,pcVar21);
      place_desc_message((WINDOW *)local_764,&local_768,local_234,pcVar21);
      place_desc_message((WINDOW *)local_764,&local_768,local_334,pcVar21);
      place_desc_message((WINDOW *)local_764,&local_768,local_434,pcVar21);
      place_desc_message((WINDOW *)local_764,&local_768,local_534,pcVar21);
      place_desc_message((WINDOW *)local_764,&local_768,local_634,pcVar21);
      wrefresh(statuswin);
      wmove(mapwin,psVar18,wVar30 + L'\xffffffff');
    }
    wVar10 = get_map_key(L'\0');
    if (wVar10 == L'\x1b') break;
    pvVar13 = memchr(" \r\n.,;:",(int)(char)wVar10,8);
    wVar15 = (wchar_t)psVar18;
    if (pvVar13 != (void *)0x0) {
      wVar10 = curses_getpos::pick_vals[(long)pvVar13 + -0x11b2f0];
LAB_0010c600:
      *local_750 = wVar30;
      *local_748 = wVar15;
      if (__ptr != (void *)0x0) {
        free(__ptr);
      }
      if (local_770 != (void *)0x0) {
        free(local_770);
      }
      curses_update_status((nh_player_info *)0x0);
      return wVar10;
    }
    nVar11 = key_to_dir(wVar10);
    if (nVar11 == DIR_NONE) {
      pp_Var14 = __ctype_tolower_loc();
      nVar11 = key_to_dir((*pp_Var14)[(uint)(wVar10 & 0xff)]);
      if (nVar11 == DIR_NONE) {
        uVar12 = 0;
        pcVar21 = (char *)0x0;
      }
      else {
        pcVar21 = (char *)(ulong)(uint)(xdir[nVar11] << 3);
        uVar12 = ydir[nVar11] << 3;
      }
    }
    else {
      pcVar21 = (char *)(ulong)(uint)xdir[nVar11];
      uVar12 = ydir[nVar11];
    }
    pcVar8 = default_drawing;
    panVar7 = display_buffer;
    iVar9 = (int)pcVar21;
    if (iVar9 == 0 && uVar12 == 0) {
      if (wVar10 < L'M') {
        if (wVar10 == L'?') {
          pcVar21 = (char *)0x0;
          curses_display_menu((nh_menuitem_conflict *)curses_getpos::helpitems,L'\x15',
                              "Targeting Help (default keys)",L'\0',(wchar_t *)0x0);
        }
        else {
          if (wVar10 != L'@') goto LAB_0010c396;
          psVar18 = (short *)(ulong)(uint)player.y;
          wVar30 = player.x;
        }
      }
      else if ((wVar10 == L'm') || (wVar10 == L'M')) {
        if (__ptr == (void *)0x0) {
          uVar25 = (ulong)(uint)player.x;
          uVar28 = (ulong)(uint)player.y;
          uVar26 = 0;
          local_77c = 0;
          panVar16 = display_buffer;
          do {
            bVar31 = uVar26 != uVar28;
            iVar9 = 0;
            iVar33 = 0;
            iVar34 = 0;
            auVar35._1_3_ = 0;
            auVar35[0] = bVar31;
            auVar35[4] = bVar31;
            auVar35._5_3_ = 0;
            auVar35[8] = bVar31;
            auVar35._9_3_ = 0;
            auVar35[0xc] = bVar31;
            auVar35._13_3_ = 0;
            lVar17 = 0x56;
            auVar36 = _DAT_0011b2c0;
            auVar37 = _DAT_0011b2b0;
            do {
              sVar4 = *(short *)((long)&panVar16[-1][0x4d].effect + lVar17);
              sVar1 = *(short *)((long)&panVar16[-1][0x4e].effect + lVar17);
              sVar2 = *(short *)((long)&panVar16[-1][0x4f].effect + lVar17);
              sVar3 = *(short *)((long)&(*panVar16)[0].effect + lVar17);
              auVar38._0_2_ = -(ushort)(sVar4 == 0);
              auVar38._2_2_ = -(ushort)(sVar4 == 0);
              auVar38._4_2_ = -(ushort)(sVar1 == 0);
              auVar38._6_2_ = -(ushort)(sVar1 == 0);
              auVar38._8_2_ = -(ushort)(sVar2 == 0);
              auVar38._10_2_ = -(ushort)(sVar2 == 0);
              auVar38._12_2_ = -(ushort)(sVar3 == 0);
              auVar38._14_2_ = -(ushort)(sVar3 == 0);
              lVar40 = auVar36._8_8_;
              lVar41 = auVar37._8_8_;
              auVar39._0_8_ =
                   CONCAT44(-(uint)(auVar36._8_4_ == player.x && auVar36._12_4_ == 0),
                            -(uint)(auVar36._4_4_ == 0 && auVar36._0_4_ == player.x)) ^
                   0xffffffffffffffff;
              auVar39._8_4_ = -(uint)(auVar37._4_4_ == 0 && auVar37._0_4_ == player.x) ^ 0xffffffff;
              auVar39._12_4_ =
                   -(uint)(auVar37._8_4_ == player.x && auVar37._12_4_ == 0) ^ 0xffffffff;
              auVar38 = ~auVar38 & (auVar39 | auVar35) & _DAT_0011b2d0;
              local_77c = local_77c + auVar38._0_4_;
              iVar9 = iVar9 + auVar38._4_4_;
              iVar33 = iVar33 + auVar38._8_4_;
              iVar34 = iVar34 + auVar38._12_4_;
              auVar36._0_8_ = auVar36._0_8_ + 4;
              auVar36._8_8_ = lVar40 + 4;
              auVar37._0_8_ = auVar37._0_8_ + 4;
              auVar37._8_8_ = lVar41 + 4;
              lVar17 = lVar17 + 0x60;
            } while (lVar17 != 0x7d6);
            local_77c = iVar34 + iVar9 + iVar33 + local_77c;
            uVar26 = uVar26 + 1;
            panVar16 = panVar16 + 1;
          } while (uVar26 != 0x15);
          __ptr = malloc((long)(int)local_77c * 8);
          psVar19 = &(*panVar7)[0].mon;
          uVar26 = 0;
          iVar9 = 0;
          do {
            uVar24 = 0;
            psVar22 = psVar19;
            do {
              if ((*psVar22 != 0) && (uVar25 != uVar24 || uVar26 != uVar28)) {
                *(int *)((long)__ptr + (long)iVar9 * 8) = (int)uVar24;
                *(int *)((long)__ptr + (long)iVar9 * 8 + 4) = (int)uVar26;
                iVar9 = iVar9 + 1;
              }
              uVar24 = uVar24 + 1;
              psVar22 = psVar22 + 0xc;
            } while (uVar24 != 0x50);
            uVar26 = uVar26 + 1;
            psVar19 = psVar19 + 0x3c0;
          } while (uVar26 != 0x15);
          qsort(__ptr,(long)(int)local_77c,8,compare_coord_dist);
          local_778 = (char *)(ulong)((uint)(wVar10 != L'm') * 2 - 1);
        }
        pcVar21 = (char *)(ulong)local_77c;
        if (local_77c == 0) {
          local_77c = 0;
        }
        else {
          iVar9 = (int)local_778;
          if (wVar10 == L'm') {
            local_778 = (char *)((long)(iVar9 + 1) % (long)(int)local_77c & 0xffffffff);
          }
          else {
            pcVar21 = (char *)0x0;
            uVar12 = local_77c;
            if (0 < iVar9) {
              uVar12 = 0;
            }
            local_778 = (char *)(ulong)((iVar9 + uVar12) - 1);
          }
          wVar30 = *(wchar_t *)((long)__ptr + (long)(int)local_778 * 8);
          psVar18 = (short *)(ulong)*(uint *)((long)__ptr + (long)(int)local_778 * 8 + 4);
        }
      }
      else {
LAB_0010c396:
        wVar23 = default_drawing->num_bgelements;
        local_770 = calloc(1,(long)wVar23);
        wVar29 = pcVar8->bg_feature_offset;
        lVar17 = (long)wVar29;
        iVar9 = 0;
        bVar32 = false;
        if (wVar29 < wVar23) {
          psVar19 = &pcVar8->bgelements[lVar17].ch;
          do {
            if (wVar10 == *psVar19) {
              iVar9 = iVar9 + 1;
              bVar32 = bVar32 + 1;
              *(byte *)((long)local_770 + lVar17) = bVar32;
            }
            lVar17 = lVar17 + 1;
            psVar19 = psVar19 + 0x14;
          } while (lVar17 < wVar23);
          bVar32 = iVar9 != 0;
        }
        pcVar21 = (char *)CONCAT71((int7)((ulong)lVar17 >> 8),wVar10 != L'^');
        if ((bool)(wVar10 != L'^' & (bVar32 ^ 1))) {
          sprintf(local_738,"Unknown targeting key %s.",local_758);
        }
        else {
          local_764._4_8_ = &(*display_buffer)[0].trap;
          bVar20 = false;
          bVar31 = true;
          do {
            bVar6 = bVar31;
            wVar23 = wVar15;
            pcVar21 = (char *)(short *)0x0;
            if (bVar6) {
              wVar23 = L'\x14';
              pcVar21 = (char *)psVar18;
            }
            if ((wchar_t)pcVar21 <= wVar23) {
              uVar25 = (ulong)(wchar_t)pcVar21;
              local_740 = (ulong)wVar23;
              psVar19 = (short *)(local_764._4_8_ + uVar25 * 0x3c0 * 2);
              uVar26 = uVar25;
              do {
                wVar29 = L'\x01';
                if (uVar26 == uVar25) {
                  wVar29 = wVar30 + L'\x01';
                }
                if (!bVar6) {
                  wVar29 = L'\x01';
                }
                wVar27 = L'O';
                if (uVar26 == local_740) {
                  wVar27 = wVar30;
                }
                if (!bVar20) {
                  wVar27 = L'O';
                }
                if (wVar29 <= wVar27) {
                  pcVar21 = (char *)(psVar19 + (long)wVar29 * 0xc);
                  do {
                    if ((((long)*(short *)((long)pcVar21 + -2) != 0) &&
                        (*(char *)((long)local_770 + (long)*(short *)((long)pcVar21 + -2)) != '\0'))
                       || ((wVar10 == L'^' && (*(short *)pcVar21 != 0)))) {
                      psVar18 = (short *)(uVar26 & 0xffffffff);
                      wVar30 = wVar29;
                      goto LAB_0010c58c;
                    }
                    wVar29 = wVar29 + L'\x01';
                    pcVar21 = (char *)((long)pcVar21 + 0x18);
                  } while (wVar27 + L'\x01' != wVar29);
                }
                uVar26 = uVar26 + 1;
                psVar19 = psVar19 + 0x3c0;
              } while (wVar23 + L'\x01' != (int)uVar26);
            }
            bVar20 = true;
            bVar31 = false;
          } while (bVar6);
          sprintf(local_738,"Can\'t find dungeon feature \'%c\'.",(ulong)(uint)(int)(char)wVar10);
        }
        curses_msgwin(local_738);
      }
    }
    else {
      psVar18 = (short *)(ulong)(uint)(1 - wVar30);
      if (iVar9 + wVar30 != 0 && SCARRY4(iVar9,wVar30) == iVar9 + wVar30 < 0) {
        psVar18 = (short *)pcVar21;
      }
      iVar9 = 0x4f - wVar30;
      if ((int)psVar18 + wVar30 < 0x50) {
        iVar9 = (int)psVar18;
      }
      uVar5 = -wVar15;
      if (-1 < uVar12 + wVar15) {
        uVar5 = uVar12;
      }
      pcVar21 = (char *)(ulong)uVar5;
      uVar12 = 0x14 - wVar15;
      if (uVar5 + wVar15 < 0x15) {
        uVar12 = uVar5;
      }
      psVar18 = (short *)(ulong)(uint)(uVar12 + wVar15);
      wVar30 = iVar9 + wVar30;
    }
LAB_0010c58c:
    wmove(mapwin,psVar18,wVar30 + L'\xffffffff');
    wrefresh();
    bVar31 = true;
  }
  wVar10 = L'\xffffffff';
  wVar15 = L'\xfffffff6';
  wVar30 = L'\xfffffff6';
  goto LAB_0010c600;
}

Assistant:

int curses_getpos(int *x, int *y, nh_bool force, const char *goal)
{
    int result = 0;
    int cx, cy;
    int key, dx, dy;
    int sidx;
    static const char pick_chars[] = " \r\n.,;:";
    static const int pick_vals[] = {1, 1, 1, 1, 2, 3, 4};
    const char *cp;
    char printbuf[BUFSZ];
    char *matching = NULL;
    enum nh_direction dir;
    struct coord *monpos = NULL;
    int moncount, monidx;
    nh_bool first_move = TRUE;

    werase(statuswin);
    mvwaddstr(statuswin, 0, 0, "Select a target location with the cursor: "
			       "'.' to confirm");
    if (!force) waddstr(statuswin, ", ESC to cancel.");
    else waddstr(statuswin, ".");
    mvwaddstr(statuswin, 1, 0, "Press '?' for help and tips.");
    wrefresh(statuswin);
    
    cx = *x >= 1 ? *x : player.x;
    cy = *y >= 0 ? *y : player.y;
    wmove(mapwin, cy, cx-1);
    
    while (1) {
	if (first_move) {
	    /* Give initial message a chance to be seen. */
	    first_move = FALSE;
	} else {
	    struct nh_desc_buf descbuf;
	    int mx = 0, my = 0;

	    /* Describe what's under the cursor in the status window. */
	    nh_describe_pos(cx, cy, &descbuf);

	    werase(statuswin);
	    place_desc_message(statuswin, &mx, &my, descbuf.effectdesc);
	    place_desc_message(statuswin, &mx, &my, descbuf.invisdesc);
	    place_desc_message(statuswin, &mx, &my, descbuf.mondesc);
	    place_desc_message(statuswin, &mx, &my, descbuf.objdesc);
	    place_desc_message(statuswin, &mx, &my, descbuf.trapdesc);
	    place_desc_message(statuswin, &mx, &my, descbuf.bgdesc);
	    wrefresh(statuswin);

	    wmove(mapwin, cy, cx-1);
	}

	dx = dy = 0;
	key = get_map_key(FALSE);
	if (key == KEY_ESC) {
	    cx = cy = -10;
	    result = -1;
	    break;
	}
	
	if ((cp = strchr(pick_chars, (char)key)) != 0) {
	    result = pick_vals[cp - pick_chars];
	    break;
	}

	dir = key_to_dir(key);
	if (dir != DIR_NONE) {
	    dx = xdir[dir];
	    dy = ydir[dir];
	} else if ( (dir = key_to_dir(tolower((unsigned char)key))) != DIR_NONE ) {
	    /* a shifted movement letter */
	    dx = xdir[dir] * 8;
	    dy = ydir[dir] * 8;
	}
	
	if (dx || dy) {
	    /* truncate at map edge */
	    if (cx + dx < 1)
		dx = 1 - cx;
	    if (cx + dx > COLNO-1)
		dx = COLNO - 1 - cx;
	    if (cy + dy < 0)
		dy = -cy;
	    if (cy + dy > ROWNO-1)
		dy = ROWNO - 1 - cy;
	    cx += dx;
	    cy += dy;
	    goto nxtc;
	}

	if (key == 'm' || key == 'M') {
	    if (!monpos) {
		int i, j;
		moncount = 0;
		for (i = 0; i < ROWNO; i++)
		    for (j = 0; j < COLNO; j++)
			if (display_buffer[i][j].mon && (j != player.x || i != player.y))
			    moncount++;
		monpos = malloc(moncount * sizeof(struct coord));
		monidx = 0;
		for (i = 0; i < ROWNO; i++)
		    for (j = 0; j < COLNO; j++)
			if (display_buffer[i][j].mon && (j != player.x || i != player.y)) {
			    monpos[monidx].x = j;
			    monpos[monidx].y = i;
			    monidx++;
			}
		qsort(monpos, moncount, sizeof(struct coord), compare_coord_dist);
		/* ready this for first increment/decrement to change to zero */
		monidx = (key == 'm') ? -1 : 1;
	    }
	    
	    if (moncount) { /* there is at least one monster to move to */
		if (key == 'm') {
		    monidx = (monidx + 1) % moncount;
		} else {
		    monidx--;
		    if (monidx < 0) monidx += moncount;
		}
		cx = monpos[monidx].x;
		cy = monpos[monidx].y;
	    }
	} else if (key == '@') {
	    cx = player.x;
	    cy = player.y;
	} else if (key == '?') {
	    static struct nh_menuitem helpitems[] = {
		{0, MI_TEXT, "Move the cursor with the direction keys:"},
		{0, MI_TEXT, ""},
		{0, MI_TEXT, "7 8 9   y k u"},
		{0, MI_TEXT, " \\|/     \\|/"},
		{0, MI_TEXT, "4- -6   h- -l"},
		{0, MI_TEXT, " /|\\     /|\\"},
		{0, MI_TEXT, "1 2 3   b j n"},
		{0, MI_TEXT, ""},
		{0, MI_TEXT, "Hold shift to move the cursor further."},
		{0, MI_TEXT, "Confirm your chosen location with one of .,;:"},
		{0, MI_TEXT, "Cancel with ESC (not always possible)."},
		{0, MI_TEXT, ""},
		{0, MI_TEXT, "Targeting shortcuts:"},
		{0, MI_TEXT, ""},
		{0, MI_TEXT, "@    self"},
		{0, MI_TEXT, "m/M  next/previous monster"},
		{0, MI_TEXT, "<    upstairs"},
		{0, MI_TEXT, ">    downstairs"},
		{0, MI_TEXT, "_    altar"},
		{0, MI_TEXT, "#    sink"},
		{0, MI_TEXT, "     (other dungeon symbols also work)"},
	    };
	    curses_display_menu(helpitems, ARRAY_SIZE(helpitems),
				"Targeting Help (default keys)",
				PICK_NONE, NULL);
	} else {
	    int k = 0, tx, ty;
	    int pass, lo_x, lo_y, hi_x, hi_y;
	    matching = malloc(default_drawing->num_bgelements);
	    memset(matching, 0, default_drawing->num_bgelements);
	    for (sidx = default_drawing->bg_feature_offset;
		 sidx < default_drawing->num_bgelements; sidx++)
		if (key == default_drawing->bgelements[sidx].ch)
		    matching[sidx] = (char) ++k;
	    if (k || key == '^') {
		for (pass = 0; pass <= 1; pass++) {
		    /* pass 0: just past current pos to lower right;
			pass 1: upper left corner to current pos */
		    lo_y = (pass == 0) ? cy : 0;
		    hi_y = (pass == 0) ? ROWNO - 1 : cy;
		    for (ty = lo_y; ty <= hi_y; ty++) {
			lo_x = (pass == 0 && ty == lo_y) ? cx + 1 : 1;
			hi_x = (pass == 1 && ty == hi_y) ? cx : COLNO - 1;
			for (tx = lo_x; tx <= hi_x; tx++) {
			    k = display_buffer[ty][tx].bg;
			    if ((k && matching[k]) ||
				(key == '^' && display_buffer[ty][tx].trap)) {
				cx = tx;
				cy = ty;
				goto nxtc;
			    }
			}	/* column */
		    }	/* row */
		}		/* pass */
		sprintf(printbuf, "Can't find dungeon feature '%c'.", (char)key);
		curses_msgwin(printbuf);
	    } else {
		sprintf(printbuf, "Unknown targeting key %s.",
			!force ? "(ESC to abort, '?' for help)" : "('?' for help)");
		curses_msgwin(printbuf);
	    }
	}

nxtc:
	wmove(mapwin, cy, cx-1);
	wrefresh(mapwin);
    }
    
    *x = cx;
    *y = cy;
    if (monpos)
	free(monpos);
    if (matching)
	free(matching);
    curses_update_status(NULL); /* clear the help message */
    return result;
}